

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O2

int tcp_listener_set_nodelay(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  undefined8 in_RAX;
  _Bool local_21 [8];
  _Bool b;
  
  local_21[0] = SUB81((ulong)in_RAX >> 0x38,0);
  iVar1 = nni_copyin_bool(local_21,buf,sz,t);
  if (arg != (void *)0x0 && iVar1 == 0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 0x130));
    *(_Bool *)((long)arg + 0x12a) = local_21[0];
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
  }
  return iVar1;
}

Assistant:

static int
tcp_listener_set_nodelay(void *arg, const void *buf, size_t sz, nni_type t)
{
	tcp_listener *l = arg;
	int           rv;
	bool          b;

	if (((rv = nni_copyin_bool(&b, buf, sz, t)) != 0) || (l == NULL)) {
		return (rv);
	}
	nni_mtx_lock(&l->mtx);
	l->nodelay = b;
	nni_mtx_unlock(&l->mtx);
	return (0);
}